

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges.cpp
# Opt level: O2

void __thiscall
sdf_tools::sdf::SdfEdges::SdfEdges
          (SdfEdges *this,vector<sdf_tools::real2,_std::allocator<sdf_tools::real2>_> *edges,
          bool inside,int nsamples)

{
  real2 rVar1;
  pointer prVar2;
  undefined7 in_register_00000011;
  
  (this->super_Sdf)._vptr_Sdf = (_func_int **)&PTR__SdfEdges_00153ff8;
  prVar2 = (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->edges_).super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>._M_impl.
  super__Vector_impl_data._M_start =
       (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->edges_).super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>._M_impl.
  super__Vector_impl_data._M_finish = prVar2;
  (this->edges_).super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (edges->super__Vector_base<sdf_tools::real2,_std::allocator<sdf_tools::real2>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->insideSign_ = (int)CONCAT71(in_register_00000011,inside) - 1U | 1;
  this->nsamples_ = nsamples;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&this->gen_,0xc0ffee);
  rVar1 = findOrigin_(this);
  this->origin_ = rVar1;
  return;
}

Assistant:

SdfEdges::SdfEdges(std::vector<real2> edges, bool inside, int nsamples) :
    edges_(std::move(edges)),
    insideSign_(inside ? 1 : -1),
    nsamples_(nsamples)
{
    origin_ = findOrigin_();
}